

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ResolveOrderGroupBy(Parse *pParse,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  ushort uVar1;
  ExprList *pEList;
  bool bVar2;
  int iVar3;
  int iVar4;
  ExprList_item *pEVar5;
  uint uVar6;
  
  iVar3 = 0;
  if ((pOrderBy != (ExprList *)0x0) && (iVar3 = 0, pParse->db->mallocFailed == '\0')) {
    iVar4 = pOrderBy->nExpr;
    if (pParse->db->aLimit[2] < iVar4) {
      sqlite3ErrorMsg(pParse,"too many terms in %s BY clause",zType);
LAB_0018a0cf:
      iVar3 = 1;
    }
    else if (0 < iVar4) {
      pEList = pSelect->pEList;
      pEVar5 = pOrderBy->a;
      uVar6 = 1;
      do {
        uVar1 = (pEVar5->u).x.iOrderByCol;
        if (uVar1 != 0) {
          if (pEList->nExpr < (int)(uint)uVar1) {
            sqlite3ErrorMsg(pParse,"%r %s BY term out of range - should be between 1 and %d",
                            (ulong)uVar6,zType);
            goto LAB_0018a0cf;
          }
          resolveAlias(pParse,pEList,uVar1 - 1,pEVar5->pExpr,zType,0);
          iVar4 = pOrderBy->nExpr;
        }
        pEVar5 = pEVar5 + 1;
        bVar2 = (int)uVar6 < iVar4;
        uVar6 = uVar6 + 1;
      } while (bVar2);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveOrderGroupBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect,      /* The SELECT statement containing the clause */
  ExprList *pOrderBy,   /* The ORDER BY or GROUP BY clause to be processed */
  const char *zType     /* "ORDER" or "GROUP" */
){
  int i;
  sqlite3 *db = pParse->db;
  ExprList *pEList;
  struct ExprList_item *pItem;

  if( pOrderBy==0 || pParse->db->mallocFailed ) return 0;
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in %s BY clause", zType);
    return 1;
  }
  pEList = pSelect->pEList;
  assert( pEList!=0 );  /* sqlite3SelectNew() guarantees this */
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    if( pItem->u.x.iOrderByCol ){
      if( pItem->u.x.iOrderByCol>pEList->nExpr ){
        resolveOutOfRangeError(pParse, zType, i+1, pEList->nExpr);
        return 1;
      }
      resolveAlias(pParse, pEList, pItem->u.x.iOrderByCol-1, pItem->pExpr,
                   zType,0);
    }
  }
  return 0;
}